

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *p)

{
  Options *opts;
  pointer pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Descriptor *desc;
  pointer piVar3;
  int *piVar4;
  FieldDescriptor *this_00;
  OneofDescriptor *pOVar5;
  pointer piVar6;
  string *psVar7;
  undefined1 split;
  int iVar8;
  FieldDescriptor *field;
  long lVar9;
  unsigned_long uVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  ulong uVar14;
  int *piVar15;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pfVar16;
  bool bVar17;
  pair<unsigned_long,_unsigned_long> pVar18;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  Formatter format;
  Iterator __begin3_1;
  string index_1;
  Iterator __end3_1;
  Iterator __begin3;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Iterator __end3;
  undefined1 local_230 [40];
  unsigned_long local_208;
  undefined1 local_200 [48];
  undefined1 local_1d0 [32];
  unsigned_long local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Iterator local_178;
  string local_168;
  char *local_148;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_140;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O1__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_128;
  Iterator local_110;
  Options local_100;
  
  desc = this->descriptor_;
  opts = &this->options_;
  Options::Options(&local_100,opts);
  anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)local_200,desc,&local_100);
  vars.len_ = ((long)(local_200._8_8_ - local_200._0_8_) >> 3) * -0x2c8590b21642c859;
  vars.ptr_ = (pointer)local_200._0_8_;
  io::Printer::WithDefs(&local_128,p,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_200);
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_100.field_listener_options.forbidden_field_listener_events.
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.annotation_guard_name._M_dataplus._M_p !=
      &local_100.annotation_guard_name.field_2) {
    operator_delete(local_100.annotation_guard_name._M_dataplus._M_p,
                    local_100.annotation_guard_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.annotation_pragma_name._M_dataplus._M_p !=
      &local_100.annotation_pragma_name.field_2) {
    operator_delete(local_100.annotation_pragma_name._M_dataplus._M_p,
                    local_100.annotation_pragma_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.runtime_include_base._M_dataplus._M_p != &local_100.runtime_include_base.field_2)
  {
    operator_delete(local_100.runtime_include_base._M_dataplus._M_p,
                    local_100.runtime_include_base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.dllexport_decl._M_dataplus._M_p != &local_100.dllexport_decl.field_2) {
    operator_delete(local_100.dllexport_decl._M_dataplus._M_p,
                    local_100.dllexport_decl.field_2._M_allocated_capacity + 1);
  }
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)local_200,this->descriptor_,opts);
  vars_00.len_ = ((long)(local_200._8_8_ - local_200._0_8_) >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = (pointer)local_200._0_8_;
  io::Printer::WithDefs(&local_140,p,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_200);
  pfVar16 = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_230 + 8);
  local_230._8_8_ = 0;
  local_230._16_8_ = 0;
  local_230._24_8_ = google::protobuf::internal::TypeCardToString_abi_cxx11_;
  if (((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) != '\x01')) {
    pcVar13 = "~0u,  // no _has_bits_\n";
    sVar11 = 0x17;
  }
  else {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n";
    sVar11 = 0x30;
  }
  format_00._M_str = pcVar13;
  format_00._M_len = sVar11;
  local_230._0_8_ = p;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (p,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),pfVar16,format_00);
  format_01._M_str = "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n";
  format_01._M_len = 0x39;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_230._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),pfVar16,format_01);
  sVar12 = 0x32;
  sVar11 = 0x19;
  if (*(int *)(this->descriptor_ + 0x88) < 1) {
    sVar12 = 0x19;
  }
  pcVar13 = "~0u,  // no _extensions_\n";
  if (0 < *(int *)(this->descriptor_ + 0x88)) {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n";
  }
  format_02._M_str = pcVar13;
  format_02._M_len = sVar12;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_230._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),pfVar16,format_02);
  if (0 < *(int *)(this->descriptor_ + 0x7c)) {
    sVar11 = 0x35;
  }
  pcVar13 = "~0u,  // no _oneof_case_\n";
  if (0 < *(int *)(this->descriptor_ + 0x7c)) {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n";
  }
  format_03._M_str = pcVar13;
  format_03._M_len = sVar11;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_230._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),pfVar16,format_03);
  sVar11 = 0x1d;
  if (0 < this->num_weak_fields_) {
    sVar11 = 0x36;
  }
  pcVar13 = "~0u,  // no _weak_field_map_\n";
  if (0 < this->num_weak_fields_) {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n";
  }
  format_04._M_str = pcVar13;
  format_04._M_len = sVar11;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_230._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),pfVar16,format_04);
  bVar17 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = 0x44;
  if (bVar17) {
    sVar11 = 0x25;
  }
  pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $inlined_string_donated_array$),\n";
  if (bVar17) {
    pcVar13 = "~0u,  // no _inlined_string_donated_\n";
  }
  format_05._M_str = pcVar13;
  format_05._M_len = sVar11;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_230._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),pfVar16,format_05);
  bVar17 = ShouldSplit(this->descriptor_,opts);
  sVar11 = 0x2e;
  if (bVar17) {
    sVar11 = 0x50;
  }
  pcVar13 = "~0u,  // no _split_\n~0u,  // no sizeof(Split)\n";
  if (bVar17) {
    pcVar13 = "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\nsizeof($classtype$::Impl_::Split),\n";
  }
  format_06._M_str = pcVar13;
  format_06._M_len = sVar11;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)local_230._0_8_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),pfVar16,format_06);
  local_178.descriptor = this->descriptor_;
  local_208 = (long)*(int *)(local_178.descriptor + 4) + (long)*(int *)(local_178.descriptor + 0x7c)
              + 8;
  local_178.idx = 0;
  local_110.idx = *(int *)(local_178.descriptor + 4);
  local_110.descriptor = local_178.descriptor;
  do {
    bVar17 = protobuf::internal::operator==(&local_178,&local_110);
    if (bVar17) {
      local_200._8_8_ = this->descriptor_;
      local_200._0_8_ = local_200._0_8_ & 0xffffffff00000000;
      local_1a8._M_dataplus._M_p._0_4_ =
           *(undefined4 *)
            ((long)&(((pointer)local_200._8_8_)->annotation_).
                    super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                    ._M_payload.
                    super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                    .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>.
                    _M_payload + 0xc);
      lVar9 = 0;
      local_1a8._M_string_length = local_200._8_8_;
      while (bVar17 = cpp::operator==((Iterator *)local_200,(Iterator *)&local_1a8), !bVar17) {
        pOVar5 = Descriptor::oneof_decl((Descriptor *)local_200._8_8_,local_200._0_4_);
        Formatter::operator()
                  ((Formatter *)local_230,"PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pOVar5 + 8));
        local_200._0_4_ = local_200._0_4_ + 1;
        lVar9 = lVar9 + 1;
      }
      if (*(int *)(this->descriptor_ + 0x7c) == (int)lVar9) {
        psVar7 = (string *)0x0;
      }
      else {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (lVar9,(long)*(int *)(this->descriptor_ + 0x7c),
                            "count == descriptor_->real_oneof_decl_count()");
      }
      if (psVar7 == (string *)0x0) {
        if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x53) == '\0') {
          piVar6 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar10 = local_208;
          if (piVar6 != piVar3) {
            uVar10 = ((long)piVar3 - (long)piVar6 >> 2) + local_208;
            piVar6 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish != piVar6) {
              pSVar1 = (pointer)(local_200 + 0x10);
              paVar2 = &local_1a8.field_2;
              uVar14 = 0;
              local_1b0 = uVar10;
              do {
                if (piVar6[uVar14] < 0) {
                  local_1a8._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"~0u","");
                }
                else {
                  lVar9 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                                    (piVar6[uVar14],(char *)pSVar1);
                  local_200._0_8_ = lVar9 - (long)pSVar1;
                  local_200._8_8_ = pSVar1;
                  local_1a8._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,pSVar1,lVar9)
                  ;
                }
                Formatter::operator()((Formatter *)local_230,"$1$,\n",&local_1a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != paVar2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
                uVar14 = uVar14 + 1;
                piVar6 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                uVar10 = local_1b0;
              } while (uVar14 < (ulong)((long)(this->has_bit_indices_).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish - (long)piVar6 >> 2)
                      );
            }
          }
        }
        else {
          format_11._M_str = "0,\n1,\n";
          format_11._M_len = 6;
          io::Printer::
          FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                    ((Printer *)local_230._0_8_,
                     (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),
                     (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_230 + 8),format_11);
          uVar10 = local_208 + 2;
        }
        piVar15 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar4 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (piVar15 != piVar4) {
          local_1b0 = uVar10 + ((long)piVar4 - (long)piVar15 >> 2);
          pSVar1 = (pointer)(local_200 + 0x10);
          do {
            if (*piVar15 < 0) {
              local_1d0._0_8_ = local_1d0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"~0u,","");
            }
            else {
              lVar9 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*piVar15,(char *)pSVar1)
              ;
              local_200._0_8_ = lVar9 - (long)pSVar1;
              local_1a8._M_dataplus._M_p = &DAT_0000001a;
              local_1a8._M_string_length = 0x3ed923;
              local_200._8_8_ = pSVar1;
              absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1d0,(AlphaNum *)local_200);
            }
            Formatter::operator()
                      ((Formatter *)local_230,"$1$\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0);
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
            }
            piVar15 = piVar15 + 1;
            uVar10 = local_1b0;
          } while (piVar15 != piVar4);
        }
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_230 + 8));
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup(&local_140);
        absl::lts_20240722::
        Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
        ::~Cleanup(&local_128);
        pVar18.second = local_208;
        pVar18.first = uVar10;
        return pVar18;
      }
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                 ,0xa15,*(undefined8 *)(psVar7 + 8),*(undefined8 *)psVar7);
LAB_0020a2a0:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_200);
    }
    this_00 = Descriptor::field(local_178.descriptor,local_178.idx);
    if (*(char *)(*(long *)(this_00 + 0x38) + 0x8c) == '\0') {
      if ((char)this_00[3] < '\0') {
        if (((byte)this_00[1] & 0x10) == 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = *(long *)(this_00 + 0x28);
          if (lVar9 == 0) {
            iVar8 = 0xa9a;
            goto LAB_0020a2cf;
          }
        }
        if (lVar9 == 0) {
          iVar8 = 0xac6;
LAB_0020a2cf:
          google::protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,iVar8);
        }
        if ((*(int *)(lVar9 + 4) == 1) && ((*(byte *)(*(long *)(lVar9 + 0x30) + 1) & 2) != 0)) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_200,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xac7,0x14,"!res->is_synthetic()");
          goto LAB_0020a2a0;
        }
        if ((char)this_00[3] < '\0') goto LAB_00209d43;
      }
      bVar17 = ShouldSplit(this_00,opts);
      local_148 = "";
      split = 0xf6;
      if (bVar17) {
        local_148 = "::Impl_::Split";
      }
      bVar17 = ShouldSplit(this_00,opts);
      if (bVar17) {
        FieldName_abi_cxx11_(&local_168,(cpp *)this_00,field);
        local_200._0_8_ = local_168._M_string_length;
        local_200._8_8_ = local_168._M_dataplus._M_p;
        local_1a8._M_dataplus._M_p = (pointer)0x1;
        local_1a8._M_string_length = 0x475d95;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1d0,(AlphaNum *)local_200);
      }
      else {
        FieldMemberName_abi_cxx11_
                  ((string *)local_1d0,(cpp *)this_00,(FieldDescriptor *)0x0,(bool)split);
      }
      Formatter::operator()
                ((Formatter *)local_230,"PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      if ((bVar17) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2)) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
    }
    else {
LAB_00209d43:
      format_07._M_str = "::_pbi::kInvalidFieldOffsetTag";
      format_07._M_len = 0x1e;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_230._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),
                 (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_230 + 8),format_07);
    }
    pfVar16 = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_230 + 8);
    bVar17 = ShouldSplit(this_00,opts);
    if (bVar17) {
      format_08._M_str = " | ::_pbi::kSplitFieldOffsetMask /*split*/";
      format_08._M_len = 0x2a;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_230._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),pfVar16,format_08);
    }
    bVar17 = IsEagerlyVerifiedLazy(this_00,opts,this->scc_analyzer_);
    sVar11 = 0x21;
    pcVar13 = " | 0x1u /*eagerly verified lazy*/";
    if (bVar17) {
LAB_00209f24:
      format_09._M_str = pcVar13;
      format_09._M_len = sVar11;
      io::Printer::
      FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                ((Printer *)local_230._0_8_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),pfVar16,format_09);
    }
    else {
      bVar17 = IsStringInlined(this_00,opts);
      sVar11 = 0x13;
      pcVar13 = " | 0x1u /*inlined*/";
      if (bVar17) goto LAB_00209f24;
    }
    format_10._M_str = ",\n";
    format_10._M_len = 2;
    io::Printer::
    FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              ((Printer *)local_230._0_8_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),pfVar16,format_10);
    local_178.idx = local_178.idx + 1;
  } while( true );
}

Assistant:

std::pair<size_t, size_t> MessageGenerator::GenerateOffsets(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  Formatter format(p);

  if (!has_bit_indices_.empty() || IsMapEntryMessage(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $has_bits$),\n");
  } else {
    format("~0u,  // no _has_bits_\n");
  }
  format("PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n");
  if (descriptor_->extension_range_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $extensions$),\n");
  } else {
    format("~0u,  // no _extensions_\n");
  }
  if (descriptor_->real_oneof_decl_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $oneof_case$[0]),\n");
  } else {
    format("~0u,  // no _oneof_case_\n");
  }
  if (num_weak_fields_ > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, $weak_field_map$),\n");
  } else {
    format("~0u,  // no _weak_field_map_\n");
  }
  if (!inlined_string_indices_.empty()) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, "
        "$inlined_string_donated_array$),\n");
  } else {
    format("~0u,  // no _inlined_string_donated_\n");
  }
  if (ShouldSplit(descriptor_, options_)) {
    format(
        "PROTOBUF_FIELD_OFFSET($classtype$, $split$),\n"
        "sizeof($classtype$::Impl_::Split),\n");
  } else {
    format(
        "~0u,  // no _split_\n"
        "~0u,  // no sizeof(Split)\n");
  }
  const int kNumGenericOffsets = 8;  // the number of fixed offsets above
  const size_t offsets = kNumGenericOffsets + descriptor_->field_count() +
                         descriptor_->real_oneof_decl_count();
  size_t entries = offsets;
  for (auto field : FieldRange(descriptor_)) {
    // TODO: We should not have an entry in the offset table for fields
    // that do not use them.
    if (field->options().weak() || field->real_containing_oneof()) {
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      format("::_pbi::kInvalidFieldOffsetTag");
    } else {
      format("PROTOBUF_FIELD_OFFSET($classtype$$1$, $2$)",
             ShouldSplit(field, options_) ? "::Impl_::Split" : "",
             ShouldSplit(field, options_)
                 ? absl::StrCat(FieldName(field), "_")
                 : FieldMemberName(field, /*split=*/false));
    }

    // Some information about a field is in the pdproto profile. The profile is
    // only available at compile time. So we embed such information in the
    // offset of the field, so that the information is available when
    // reflectively accessing the field at run time.
    //
    // We embed whether the field is cold to the MSB of the offset, and whether
    // the field is eagerly verified lazy or inlined string to the LSB of the
    // offset.

    if (ShouldSplit(field, options_)) {
      format(" | ::_pbi::kSplitFieldOffsetMask /*split*/");
    }
    if (IsEagerlyVerifiedLazy(field, options_, scc_analyzer_)) {
      format(" | 0x1u /*eagerly verified lazy*/");
    } else if (IsStringInlined(field, options_)) {
      format(" | 0x1u /*inlined*/");
    }
    format(",\n");
  }

  int count = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _impl_.$1$_),\n", oneof->name());
    count++;
  }
  ABSL_CHECK_EQ(count, descriptor_->real_oneof_decl_count());

  if (IsMapEntryMessage(descriptor_)) {
    entries += 2;
    format(
        "0,\n"
        "1,\n");
  } else if (!has_bit_indices_.empty()) {
    entries += has_bit_indices_.size();
    for (size_t i = 0; i < has_bit_indices_.size(); ++i) {
      const std::string index =
          has_bit_indices_[i] >= 0 ? absl::StrCat(has_bit_indices_[i]) : "~0u";
      format("$1$,\n", index);
    }
  }
  if (!inlined_string_indices_.empty()) {
    entries += inlined_string_indices_.size();
    for (int inlined_string_index : inlined_string_indices_) {
      const std::string index =
          inlined_string_index >= 0
              ? absl::StrCat(inlined_string_index, ",  // inlined_string_index")
              : "~0u,";
      format("$1$\n", index);
    }
  }

  return std::make_pair(entries, offsets);
}